

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O0

void __thiscall
chrono::ChMatrix33<double>::Set_A_quaternion(ChMatrix33<double> *this,ChQuaternion<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *pdVar20;
  Scalar *pSVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double e2e3;
  double e1e3;
  double e1e2;
  double e0e3;
  double e0e2;
  double e0e1;
  double e3e3;
  double e2e2;
  double e1e1;
  double e0e0;
  ChQuaternion<double> *q_local;
  ChMatrix33<double> *this_local;
  
  pdVar20 = ChQuaternion<double>::e0(q);
  dVar1 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e0(q);
  dVar1 = dVar1 * *pdVar20;
  pdVar20 = ChQuaternion<double>::e1(q);
  dVar2 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e1(q);
  dVar3 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e2(q);
  dVar4 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e2(q);
  dVar5 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e3(q);
  dVar6 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e3(q);
  dVar7 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e0(q);
  dVar8 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e1(q);
  dVar9 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e0(q);
  dVar10 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e2(q);
  dVar11 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e0(q);
  dVar12 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e3(q);
  dVar13 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e1(q);
  dVar14 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e2(q);
  dVar15 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e1(q);
  dVar16 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e3(q);
  dVar17 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e2(q);
  dVar18 = *pdVar20;
  pdVar20 = ChQuaternion<double>::e3(q);
  dVar19 = *pdVar20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1 + dVar2 * dVar3;
  auVar22 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar22,ZEXT816(0xbff0000000000000));
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,0,0);
  *pSVar21 = auVar22._0_8_;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,0,1);
  *pSVar21 = (dVar14 * dVar15 - dVar12 * dVar13) * 2.0;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,0,2);
  *pSVar21 = (dVar16 * dVar17 + dVar10 * dVar11) * 2.0;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,1,0);
  *pSVar21 = (dVar14 * dVar15 + dVar12 * dVar13) * 2.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 + dVar4 * dVar5;
  auVar22 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar23,ZEXT816(0xbff0000000000000));
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,1,1);
  *pSVar21 = auVar22._0_8_;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,1,2);
  *pSVar21 = (dVar18 * dVar19 - dVar8 * dVar9) * 2.0;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,2,0);
  *pSVar21 = (dVar16 * dVar17 - dVar10 * dVar11) * 2.0;
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,2,1);
  *pSVar21 = (dVar18 * dVar19 + dVar8 * dVar9) * 2.0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 + dVar6 * dVar7;
  auVar22 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar24,ZEXT816(0xbff0000000000000));
  pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)this,2,2);
  *pSVar21 = auVar22._0_8_;
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_quaternion(const ChQuaternion<Real>& q) {
    Real e0e0 = q.e0() * q.e0();
    Real e1e1 = q.e1() * q.e1();
    Real e2e2 = q.e2() * q.e2();
    Real e3e3 = q.e3() * q.e3();
    Real e0e1 = q.e0() * q.e1();
    Real e0e2 = q.e0() * q.e2();
    Real e0e3 = q.e0() * q.e3();
    Real e1e2 = q.e1() * q.e2();
    Real e1e3 = q.e1() * q.e3();
    Real e2e3 = q.e2() * q.e3();

    (*this)(0, 0) = (e0e0 + e1e1) * 2 - 1;
    (*this)(0, 1) = (e1e2 - e0e3) * 2;
    (*this)(0, 2) = (e1e3 + e0e2) * 2;
    (*this)(1, 0) = (e1e2 + e0e3) * 2;
    (*this)(1, 1) = (e0e0 + e2e2) * 2 - 1;
    (*this)(1, 2) = (e2e3 - e0e1) * 2;
    (*this)(2, 0) = (e1e3 - e0e2) * 2;
    (*this)(2, 1) = (e2e3 + e0e1) * 2;
    (*this)(2, 2) = (e0e0 + e3e3) * 2 - 1;
}